

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O3

void __thiscall
spdlog::details::circular_q<spdlog::details::async_msg>::push_back
          (circular_q<spdlog::details::async_msg> *this,async_msg *item)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this->max_items_ != 0) {
    async_msg::operator=
              ((this->v_).
               super__Vector_base<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>
               ._M_impl.super__Vector_impl_data._M_start + this->tail_,item);
    uVar2 = (this->tail_ + 1) % this->max_items_;
    this->tail_ = uVar2;
    if (uVar2 == this->head_) {
      uVar1 = 0;
      if (uVar2 + 1 != this->max_items_) {
        uVar1 = uVar2 + 1;
      }
      this->head_ = uVar1;
      this->overrun_counter_ = this->overrun_counter_ + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item)
    {
        if (max_items_ > 0)
        {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_) // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }